

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::BlockManager::UpdateBlockInfo(BlockManager *this,CBlock *block,uint nHeight,FlatFilePos *pos)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  optional<node::BlockfileCursor> *poVar4;
  size_t sVar5;
  uint uVar6;
  pointer pCVar8;
  uint uVar9;
  long in_FS_OFFSET;
  int nFile;
  undefined4 uStack_54;
  CBlock *local_50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  _Storage<node::BlockfileCursor,_true> _Var7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock17,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x39c,false);
  bVar3 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value <= (int)nHeight &
          (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  poVar4 = (this->m_blockfile_cursors)._M_elems + bVar3;
  if ((this->m_blockfile_cursors)._M_elems[bVar3].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged == true) {
    uVar6 = pos->nFile;
    if ((int)uVar6 <=
        (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num)
    goto LAB_0075df0f;
  }
  else {
    uVar6 = pos->nFile;
    (this->m_blockfile_cursors)._M_elems[bVar3].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
  }
  _Var7._M_value.undo_height = 0;
  _Var7._M_value.file_num = uVar6;
  (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
  super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var7;
LAB_0075df0f:
  _nFile = &::TX_WITH_WITNESS;
  local_50 = block;
  sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&nFile);
  iVar1 = pos->nFile;
  _nFile = (TransactionSerParams *)CONCAT44(uStack_54,iVar1);
  pCVar8 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)(((long)(this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar8) / 0x28) <= iVar1) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (&this->m_blockfile_info,(long)iVar1 + 1);
    pCVar8 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  CBlockFileInfo::AddBlock(pCVar8 + iVar1,nHeight,(ulong)(block->super_CBlockHeader).nTime);
  uVar9 = (int)sVar5 + pos->nPos;
  pCVar8 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = pCVar8[nFile].nSize;
  if (uVar9 <= uVar6) {
    uVar9 = uVar6;
  }
  pCVar8[nFile].nSize = uVar9;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->m_dirty_fileinfo,&nFile);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::UpdateBlockInfo(const CBlock& block, unsigned int nHeight, const FlatFilePos& pos)
{
    LOCK(cs_LastBlockFile);

    // Update the cursor so it points to the last file.
    const BlockfileType chain_type{BlockfileTypeForHeight(nHeight)};
    auto& cursor{m_blockfile_cursors[chain_type]};
    if (!cursor || cursor->file_num < pos.nFile) {
        m_blockfile_cursors[chain_type] = BlockfileCursor{pos.nFile};
    }

    // Update the file information with the current block.
    const unsigned int added_size = ::GetSerializeSize(TX_WITH_WITNESS(block));
    const int nFile = pos.nFile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }
    m_blockfile_info[nFile].AddBlock(nHeight, block.GetBlockTime());
    m_blockfile_info[nFile].nSize = std::max(pos.nPos + added_size, m_blockfile_info[nFile].nSize);
    m_dirty_fileinfo.insert(nFile);
}